

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
RCONIRCCommand::trigger
          (RCONIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  IRC_Bot *pIVar1;
  char *pcVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_f8;
  char *local_f0;
  string local_c8;
  __sv_type local_a8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  size_t local_88;
  char *local_80;
  long local_78;
  size_t server_count;
  char *local_68;
  long local_60;
  Channel *chan;
  char *local_50;
  RCONIRCCommand *local_48;
  size_t local_40;
  IRC_Bot *local_38;
  IRC_Bot *source_local;
  RCONIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (RCONIRCCommand *)nick._M_len;
  pcVar6 = channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  local_38 = source;
  source_local = (IRC_Bot *)this;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  pIVar1 = local_38;
  if (bVar3) {
    local_48 = this_local;
    local_40 = nick_local._M_len;
    _chan = sv("Error: Too Few Parameters. Syntax: rcon <input>",0x2f);
    Jupiter::IRC::Client::sendNotice(pIVar1,local_48,local_40,chan,local_50);
  }
  else {
    server_count = (size_t)nick_local._M_str;
    local_68 = pcVar6;
    local_60 = Jupiter::IRC::Client::getChannel(local_38,nick_local._M_str,pcVar6);
    if (local_60 != 0) {
      uVar5 = RenX::getCore();
      uVar4 = Jupiter::IRC::Client::Channel::getType();
      local_88 = parameters._M_len;
      local_80 = parameters._M_str;
      local_78 = RenX::Core::send(uVar5,uVar4,parameters._M_len,parameters._M_str);
      pcVar2 = nick_local._M_str;
      pIVar1 = local_38;
      if (local_78 == 0) {
        bVar7 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_f8 = bVar7._M_len;
        local_f0 = bVar7._M_str;
        Jupiter::IRC::Client::sendMessage(pIVar1,pcVar2,pcVar6,local_f8,local_f0);
      }
      else {
        channel_local._M_len._0_4_ = channel._M_str._0_4_;
        channel_local._M_len._4_4_ = channel._M_str._4_4_;
        local_98 = nick_local._M_str._0_4_;
        uStack_94 = nick_local._M_str._4_4_;
        uStack_90 = (undefined4)channel_local._M_len;
        uStack_8c = channel_local._M_len._4_4_;
        string_printf_abi_cxx11_(&local_c8,"Command sent to %u servers.",local_78);
        local_a8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c8);
        Jupiter::IRC::Client::sendMessage
                  (pIVar1,CONCAT44(uStack_94,local_98),CONCAT44(uStack_8c,uStack_90),local_a8._M_len
                   ,local_a8._M_str);
        std::__cxx11::string::~string((string *)&local_c8);
      }
    }
  }
  return;
}

Assistant:

void RCONIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: rcon <input>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	size_t server_count = RenX::getCore()->send(chan->getType(), parameters);
	if (server_count > 0) {
		source->sendMessage(channel, string_printf("Command sent to %u servers.", server_count));
	}
	else {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}